

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O1

void Imf_3_4::anon_unknown_1::initialize
               (Header *header,Box2i *displayWindow,Box2i *dataWindow,float pixelAspectRatio,
               V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder,
               Compression compression)

{
  ArgExc *this;
  stringstream _iex_throw_s;
  float local_1b8;
  Compression local_1b4;
  LineOrder local_1b0;
  float local_1ac;
  undefined1 local_1a8 [16];
  _Rb_tree_node_base local_198;
  size_t local_178;
  
  local_1b8 = pixelAspectRatio;
  local_1b4 = compression;
  local_1b0 = lineOrder;
  local_1ac = screenWindowWidth;
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::TypedAttribute
            ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *)local_1a8,displayWindow);
  Header::insert(header,"displayWindow",(Attribute *)local_1a8);
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *)local_1a8);
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::TypedAttribute
            ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *)local_1a8,dataWindow);
  Header::insert(header,"dataWindow",(Attribute *)local_1a8);
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *)local_1a8);
  if (((int)ABS(local_1b8) - 0x800000U < 0x7f000000) && (0.0 <= local_1b8)) {
    TypedAttribute<float>::TypedAttribute((TypedAttribute<float> *)local_1a8,&local_1b8);
    Header::insert(header,"pixelAspectRatio",(Attribute *)local_1a8);
    TypedAttribute<float>::~TypedAttribute((TypedAttribute<float> *)local_1a8);
    TypedAttribute<Imath_3_2::Vec2<float>_>::TypedAttribute
              ((TypedAttribute<Imath_3_2::Vec2<float>_> *)local_1a8,screenWindowCenter);
    Header::insert(header,"screenWindowCenter",(Attribute *)local_1a8);
    TypedAttribute<Imath_3_2::Vec2<float>_>::~TypedAttribute
              ((TypedAttribute<Imath_3_2::Vec2<float>_> *)local_1a8);
    TypedAttribute<float>::TypedAttribute((TypedAttribute<float> *)local_1a8,&local_1ac);
    Header::insert(header,"screenWindowWidth",(Attribute *)local_1a8);
    TypedAttribute<float>::~TypedAttribute((TypedAttribute<float> *)local_1a8);
    TypedAttribute<Imf_3_4::LineOrder>::TypedAttribute
              ((TypedAttribute<Imf_3_4::LineOrder> *)local_1a8,&local_1b0);
    Header::insert(header,"lineOrder",(Attribute *)local_1a8);
    TypedAttribute<Imf_3_4::LineOrder>::~TypedAttribute
              ((TypedAttribute<Imf_3_4::LineOrder> *)local_1a8);
    TypedAttribute<Imf_3_4::Compression>::TypedAttribute
              ((TypedAttribute<Imf_3_4::Compression> *)local_1a8,&local_1b4);
    Header::insert(header,"compression",(Attribute *)local_1a8);
    TypedAttribute<Imf_3_4::Compression>::~TypedAttribute
              ((TypedAttribute<Imf_3_4::Compression> *)local_1a8);
    local_178 = 0;
    local_198._M_left = (_Base_ptr)0x0;
    local_198._M_right = (_Base_ptr)0x0;
    local_198._M_color = 0;
    local_198._4_4_ = 0;
    local_198._M_parent = (_Base_ptr)0x0;
    local_1a8._0_8_ = (_func_int **)0x0;
    local_1a8._8_4_ = 0.0;
    local_1a8._12_4_ = 0.0;
    Attribute::Attribute((Attribute *)local_1a8);
    local_1a8._0_8_ = &PTR__TypedAttribute_001e4d98;
    local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
    local_198._M_parent = (_Base_ptr)0x0;
    local_178 = 0;
    local_198._M_left = &local_198;
    local_198._M_right = &local_198;
    Header::insert(header,"channels",(Attribute *)local_1a8);
    TypedAttribute<Imf_3_4::ChannelList>::~TypedAttribute
              ((TypedAttribute<Imf_3_4::ChannelList> *)local_1a8);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Invalid pixel aspect ratio",0x1a);
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this,(stringstream *)local_1a8);
  __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
initialize (
    Header&      header,
    const Box2i& displayWindow,
    const Box2i& dataWindow,
    float        pixelAspectRatio,
    const V2f&   screenWindowCenter,
    float        screenWindowWidth,
    LineOrder    lineOrder,
    Compression  compression)
{
    header.insert ("displayWindow", Box2iAttribute (displayWindow));
    header.insert ("dataWindow", Box2iAttribute (dataWindow));
    if (!std::isnormal (pixelAspectRatio) || pixelAspectRatio < 0.f)
        THROW (IEX_NAMESPACE::ArgExc, "Invalid pixel aspect ratio");
    header.insert ("pixelAspectRatio", FloatAttribute (pixelAspectRatio));
    header.insert ("screenWindowCenter", V2fAttribute (screenWindowCenter));
    header.insert ("screenWindowWidth", FloatAttribute (screenWindowWidth));
    header.insert ("lineOrder", LineOrderAttribute (lineOrder));
    header.insert ("compression", CompressionAttribute (compression));
    header.insert ("channels", ChannelListAttribute ());
}